

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  byte bVar1;
  char cVar2;
  curl_ssl_ctx_callback p_Var3;
  Curl_chunker *pCVar4;
  proxy_info *ppVar5;
  ssl_config_data *psVar6;
  ssl_config_data *psVar7;
  _Bool _Var8;
  int iVar9;
  curl_proxytype cVar10;
  CURLcode CVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  CURLcode CVar16;
  time_t timeout_ms;
  SSL_CIPHER *c;
  char *pcVar17;
  timediff_t tVar18;
  uint *puVar19;
  SSL_METHOD *meth;
  SSL_CTX *pSVar20;
  ulong uVar21;
  long lVar22;
  SSL_SESSION *ses;
  BIO_METHOD *pBVar23;
  stack_st_X509 *psVar24;
  BIO *pBVar25;
  X509_NAME *pXVar26;
  size_t sVar27;
  undefined8 uVar28;
  ASN1_INTEGER *pAVar29;
  ASN1_STRING *pAVar30;
  X509_EXTENSION *ex;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar31;
  Curl_easy *pCVar32;
  char **ppcVar33;
  GENERAL_NAMES *a_00;
  int *piVar34;
  BIO *__s;
  X509 *pXVar35;
  undefined8 extraout_RAX;
  X509_NAME_ENTRY *ne;
  void *__src;
  PKCS12 *p12;
  UI_METHOD *method;
  UI_METHOD *pUVar36;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SSL *pSVar37;
  EVP_PKEY *pEVar38;
  evp_pkey_st *peVar39;
  rsa_st *r;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  undefined8 *puVar40;
  size_t uznum;
  OCSP_RESPONSE *resp;
  X509_PUBKEY *pXVar41;
  uchar *pubkey;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar42;
  OCSP_SINGLERESP *single;
  long lVar43;
  ssl_primary_config *psVar44;
  undefined7 uVar45;
  curl_socket_t writefd;
  undefined7 in_register_00000011;
  long lVar46;
  size_t size;
  char **ppcVar47;
  size_t size_00;
  char *pcVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  curl_socket_t readfd0;
  Curl_easy *pCVar52;
  ENGINE *e;
  Curl_easy *pCVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  X509 *pXVar57;
  int iVar58;
  long lVar59;
  X509 *pXVar60;
  bool bVar61;
  char *ptr;
  curl_socket_t local_c64;
  Curl_easy *local_c60;
  BIO *local_c58;
  Curl_easy *local_c50;
  Curl_easy *local_c48;
  X509 *x509;
  BIO *local_c38;
  X509 *local_c30;
  BIO *local_c28;
  Curl_easy *local_c20;
  Curl_easy *local_c18;
  stack_st_X509 *local_c10;
  X509_ALGOR *palg;
  ASN1_BIT_STRING *psig;
  Curl_easy *local_bf8;
  uint local_bec;
  Curl_easy *local_be8;
  _Bool *local_be0;
  X509 *local_bd8;
  long local_bd0;
  char *local_bc8;
  char *local_bc0;
  in6_addr addr;
  anon_struct_16_2_531ec2c5 params;
  char error_buffer [256];
  char error_buffer_1 [256];
  
  local_c28 = (BIO *)CONCAT44(local_c28._4_4_,(int)CONCAT71(in_register_00000011,nonblocking));
  lVar59 = (long)sockindex;
  pXVar57 = (X509 *)(lVar59 * 0x18);
  if (conn->ssl[lVar59].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar32 = conn->data;
  pCVar4 = &conn->chunk;
  local_c58 = (BIO *)CONCAT44(local_c58._4_4_,conn->sock[lVar59]);
  iVar9 = *(int *)((long)&pXVar57[3].valid + (long)pCVar4);
  if (iVar9 == 0) {
    tVar18 = Curl_timeleft(pCVar32,(curltime *)0x0,true);
    if (tVar18 < 0) {
LAB_003b7084:
      Curl_failf(pCVar32,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    pCVar52 = conn->data;
    local_c48 = (Curl_easy *)CONCAT44(local_c48._4_4_,sockindex);
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      local_c38 = (BIO *)(conn->http_proxy).host.name;
      lVar22 = 0xb68;
      lVar43 = 0x350;
      lVar51 = 0x358;
      lVar46 = 0x360;
      lVar56 = 0xb98;
      lVar54 = 0xb90;
      lVar55 = 0x340;
      lVar49 = 0xb60;
    }
    else {
      local_c38 = (BIO *)(conn->host).name;
      lVar22 = 0xab8;
      lVar43 = 0x300;
      lVar51 = 0x308;
      lVar46 = 0x310;
      lVar56 = 0xae8;
      lVar54 = 0xae0;
      lVar55 = 0x2f0;
      lVar49 = 0xab0;
    }
    local_c64 = conn->sock[lVar59];
    local_c10 = *(stack_st_X509 **)((conn->chunk).hexbuffer + lVar51 + -0x20);
    local_c18 = *(Curl_easy **)((long)pCVar52->sockets + lVar56 + -0x80);
    uVar21 = *(ulong *)((conn->chunk).hexbuffer + lVar55 + -0x20);
    local_c60 = *(Curl_easy **)((long)pCVar52->sockets + lVar54 + -0x80);
    pXVar35 = *(X509 **)((conn->chunk).hexbuffer + lVar46 + -0x20);
    bVar1 = (conn->chunk).hexbuffer[lVar43 + -0x20];
    pCVar53 = *(Curl_easy **)((long)pCVar52->sockets + lVar22 + -0x80);
    local_c30 = pXVar57;
    local_bf8 = pCVar32;
    local_be0 = done;
    CVar11 = Curl_ossl_seed(pCVar52);
    if (CVar11 != CURLE_OK) {
      return CVar11;
    }
    local_bec = (uint)bVar1;
    *(undefined8 *)((long)pCVar52->sockets + lVar49 + -0x80) = 1;
    local_c20 = pCVar53;
    local_bd8 = pXVar35;
    local_bd0 = lVar59;
    if (7 < uVar21) {
      Curl_failf(pCVar52,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
    if ((0xf3UL >> (uVar21 & 0x3f) & 1) == 0) {
      if (uVar21 == 2) {
        pcVar48 = "OpenSSL was built without SSLv2 support";
      }
      else {
        pcVar48 = "OpenSSL was built without SSLv3 support";
      }
      Curl_failf(pCVar52,pcVar48);
      return CURLE_NOT_BUILT_IN;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    pSVar20 = (SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4);
    if (pSVar20 != (SSL_CTX *)0x0) {
      SSL_CTX_free(pSVar20);
    }
    pSVar20 = SSL_CTX_new(meth);
    pXVar35 = local_c30;
    **(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4) = pSVar20;
    if (pSVar20 == (SSL_CTX *)0x0) {
      uVar21 = ERR_peek_error();
      ERR_error_string_n(uVar21,error_buffer,0x100);
      Curl_failf(pCVar52,"SSL: couldn\'t create a context: %s",error_buffer);
      return CURLE_OUT_OF_MEMORY;
    }
    SSL_CTX_ctrl(pSVar20,0x21,0x10,(void *)0x0);
    if (((pCVar52->set).fdebug != (curl_debug_callback)0x0) && ((pCVar52->set).verbose == true)) {
      SSL_CTX_set_msg_callback
                ((SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),ssl_tls_trace);
      SSL_CTX_ctrl((SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),0x10,0,conn);
    }
    uVar50 = 0x80024850;
    cVar10 = (conn->http_proxy).proxytype;
    if ((cVar10 == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      cVar2 = (pCVar52->set).proxy_ssl.enable_beast;
    }
    else {
      cVar2 = (pCVar52->set).ssl.enable_beast;
    }
    if (cVar2 == '\0') {
      uVar50 = 0x80024050;
    }
    sockindex = (int)local_c48;
    if ((0xf3UL >> (uVar21 & 0x3f) & 1) == 0) {
      if (uVar21 == 2) {
        uVar21 = uVar50 | 0x3e000000;
      }
      else {
        uVar21 = uVar50 | 0x3c000000;
      }
    }
    else {
      if (cVar10 == CURLPROXY_HTTPS) {
        bVar61 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        psVar44 = &conn->proxy_ssl_config;
        if (bVar61) {
          psVar44 = &conn->ssl_config;
        }
        lVar59 = 0x348;
        if (bVar61) {
          lVar59 = 0x2f8;
        }
      }
      else {
        psVar44 = &conn->ssl_config;
        lVar59 = 0x2f8;
      }
      uVar21 = uVar50 | 0x2000000;
      lVar22 = psVar44->version;
      lVar59 = *(long *)((conn->chunk).hexbuffer + lVar59 + -0x20);
      if (lVar22 == 5) {
LAB_003b749b:
        uVar21 = uVar21 | 0x4000000;
      }
      else {
        if (lVar22 == 6) {
LAB_003b7494:
          uVar21 = uVar21 | 0x10000000;
          goto LAB_003b749b;
        }
        if (lVar22 == 7) {
          SSL_CTX_ctrl((SSL_CTX *)**(undefined8 **)((long)&conn->ssl[0].backend + (long)pXVar35),
                       0x7c,0x304,(void *)0x0);
          uVar21 = uVar50 | 0xa000000;
          goto LAB_003b7494;
        }
      }
      if (lVar59 != 0x60000) {
        if (lVar59 != 0x50000) {
          if (lVar59 != 0x40000) goto LAB_003b825a;
          uVar21 = uVar21 | 0x10000000;
        }
        uVar21 = uVar21 | 0x8000000;
      }
      uVar21 = uVar21 | 0x20000000;
    }
LAB_003b825a:
    SSL_CTX_set_options(**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),uVar21);
    if ((conn->bits).tls_enable_npn == true) {
      SSL_CTX_set_next_proto_select_cb
                ((SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),
                 select_next_proto_cb,conn);
    }
    if ((conn->bits).tls_enable_alpn == true) {
      builtin_strncpy(error_buffer_1,"\bhttp/1.1",9);
      Curl_infof(pCVar52,"ALPN, offering %s\n","http/1.1");
      SSL_CTX_set_alpn_protos
                (**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),error_buffer_1,9);
    }
    if (local_c60 != (Curl_easy *)0x0 || local_c18 != (Curl_easy *)0x0) {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        psVar6 = &(pCVar52->set).ssl;
        psVar7 = &(pCVar52->set).ssl;
        bVar61 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        if (!bVar61) {
          psVar7 = &(pCVar52->set).proxy_ssl;
          psVar6 = &(pCVar52->set).proxy_ssl;
        }
        ppcVar33 = &psVar6->key;
        ppcVar47 = &psVar7->key_type;
        lVar59 = 0xbb0;
        if (bVar61) {
          lVar59 = 0xb00;
        }
      }
      else {
        ppcVar33 = &(pCVar52->set).ssl.key;
        ppcVar47 = &(pCVar52->set).ssl.key_type;
        lVar59 = 0xb00;
      }
      pSVar20 = (SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4);
      bVar61 = local_c60 != (Curl_easy *)0x0;
      local_be8 = (Curl_easy *)*ppcVar33;
      local_bc8 = *ppcVar47;
      pcVar48 = *(char **)((long)pCVar52->sockets + lVar59 + -0x80);
      pCVar32 = conn->data;
      iVar9 = do_file_type((char *)local_c18);
      pXVar35 = local_c30;
      if (iVar9 == 0x2a || bVar61) {
        local_c50 = pCVar32;
        if (pcVar48 != (char *)0x0) {
          SSL_CTX_set_default_passwd_cb_userdata(pSVar20,pcVar48);
          SSL_CTX_set_default_passwd_cb(pSVar20,passwd_callback);
        }
        pCVar53 = local_c50;
        pCVar32 = local_c60;
        if (iVar9 == 0x2b) {
          ptr = (char *)0x0;
          pBVar23 = BIO_s_file();
          pBVar25 = BIO_new(pBVar23);
          pCVar32 = local_c60;
          if (pBVar25 != (BIO *)0x0) {
            lVar59 = BIO_ctrl(pBVar25,0x6c,3,local_c60);
            if ((int)lVar59 < 1) {
              Curl_failf(local_c50,"could not open PKCS12 file \'%s\'",pCVar32);
              BIO_free(pBVar25);
              return CURLE_SSL_CERTPROBLEM;
            }
            p12 = d2i_PKCS12_bio(pBVar25,(PKCS12 **)0x0);
            BIO_free(pBVar25);
            if (p12 == (PKCS12 *)0x0) {
              pcVar48 = "error reading PKCS12 file \'%s\'";
              pCVar32 = local_c60;
              pCVar53 = local_c50;
              goto LAB_003b8acf;
            }
            PKCS12_PBE_add();
            iVar9 = PKCS12_parse(p12,pcVar48,(EVP_PKEY **)&params,(X509 **)&x509,
                                 (stack_st_X509 **)&ptr);
            if (iVar9 == 0) {
              uVar21 = ERR_get_error();
              ERR_error_string_n(uVar21,error_buffer_1,0x100);
              Curl_failf(local_c50,"could not parse PKCS12 file, check password, OpenSSL error %s",
                         error_buffer_1);
              PKCS12_free(p12);
              return CURLE_SSL_CERTPROBLEM;
            }
            PKCS12_free(p12);
            iVar9 = SSL_CTX_use_certificate(pSVar20,(X509 *)x509);
            if (iVar9 == 1) {
              iVar9 = SSL_CTX_use_PrivateKey(pSVar20,(EVP_PKEY *)params.cert_id);
              if (iVar9 == 1) {
                iVar9 = SSL_CTX_check_private_key(pSVar20);
                if (iVar9 != 0) {
                  if (ptr != (char *)0x0) {
                    do {
                      iVar9 = OPENSSL_sk_num(ptr);
                      if (iVar9 == 0) goto LAB_003b9d66;
                      pXVar35 = (X509 *)OPENSSL_sk_pop(ptr);
                      iVar9 = SSL_CTX_add_client_CA(pSVar20,pXVar35);
                      if (iVar9 == 0) {
                        X509_free(pXVar35);
                        pcVar48 = "cannot add certificate to client CA list";
                        goto LAB_003b9dac;
                      }
                      lVar59 = SSL_CTX_ctrl(pSVar20,0xe,0,pXVar35);
                    } while (lVar59 != 0);
                    X509_free(pXVar35);
                    pcVar48 = "cannot add certificate to certificate chain";
LAB_003b9dac:
                    Curl_failf(local_c50,pcVar48);
                    goto LAB_003b9d3c;
                  }
LAB_003b9d66:
                  EVP_PKEY_free((EVP_PKEY *)params.cert_id);
                  X509_free((X509 *)x509);
                  OPENSSL_sk_pop_free(ptr,X509_free);
                  bVar61 = false;
                  pCVar53 = local_c50;
                  goto LAB_003b87fa;
                }
                pcVar48 = 
                "private key from PKCS12 file \'%s\' does not match certificate in same file";
                pCVar32 = local_c60;
              }
              else {
                pcVar48 = "unable to use private key from PKCS12 file \'%s\'";
                pCVar32 = local_c60;
              }
            }
            else {
              uVar21 = ERR_get_error();
              ERR_error_string_n(uVar21,error_buffer_1,0x100);
              pcVar48 = "could not load PKCS12 client certificate, OpenSSL error %s";
              pCVar32 = (Curl_easy *)error_buffer_1;
            }
            Curl_failf(local_c50,pcVar48,pCVar32);
LAB_003b9d3c:
            EVP_PKEY_free((EVP_PKEY *)params.cert_id);
            X509_free((X509 *)x509);
            OPENSSL_sk_pop_free(ptr,X509_free);
            return CURLE_SSL_CERTPROBLEM;
          }
          uVar21 = ERR_get_error();
          ERR_error_string_n(uVar21,error_buffer_1,0x100);
          pcVar48 = "BIO_new return NULL, OpenSSL error %s";
          pCVar53 = local_c50;
LAB_003b8acc:
          pCVar32 = (Curl_easy *)error_buffer_1;
LAB_003b8acf:
          Curl_failf(pCVar53,pcVar48,pCVar32);
          return CURLE_SSL_CERTPROBLEM;
        }
        if (iVar9 == 2) {
          iVar9 = SSL_CTX_use_certificate_file(pSVar20,(char *)local_c60,2);
          pCVar53 = local_c50;
          bVar61 = true;
          if (iVar9 != 1) {
            uVar21 = ERR_get_error();
            ERR_error_string_n(uVar21,error_buffer_1,0x100);
            pcVar48 = 
            "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
            ;
            goto LAB_003b8acc;
          }
        }
        else if (iVar9 == 0x2a) {
          e = (ENGINE *)(local_c50->state).engine;
          if (e == (ENGINE *)0x0) {
            _Var8 = is_pkcs11_uri((char *)local_c60);
            if ((_Var8) && (CVar11 = Curl_ossl_set_engine(pCVar53,"pkcs11"), CVar11 != CURLE_OK)) {
              return CURLE_SSL_CERTPROBLEM;
            }
            e = (ENGINE *)(pCVar53->state).engine;
            if (e == (ENGINE *)0x0) {
              pcVar48 = "crypto engine not set, can\'t load certificate";
              goto LAB_003b9d16;
            }
          }
          params.cert_id = (char *)pCVar32;
          params.cert = (X509 *)0x0;
          iVar9 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
          if (iVar9 == 0) {
            pcVar48 = "ssl engine does not support loading certificates";
            goto LAB_003b9d16;
          }
          iVar9 = ENGINE_ctrl_cmd((ENGINE *)(pCVar53->state).engine,"LOAD_CERT_CTRL",0,&params,
                                  (f *)0x0,1);
          if (iVar9 == 0) {
            uVar21 = ERR_get_error();
            pcVar48 = error_buffer_1;
            ERR_error_string_n(uVar21,pcVar48,0x100);
            pcVar17 = "ssl engine cannot load client cert with id \'%s\' [%s]";
            goto LAB_003b8d5e;
          }
          if (params.cert == (X509 *)0x0) {
            pcVar48 = "ssl engine didn\'t initialized the certificate properly.";
            goto LAB_003b9d16;
          }
          iVar9 = SSL_CTX_use_certificate(pSVar20,(X509 *)params.cert);
          if (iVar9 != 1) {
            Curl_failf(pCVar53,"unable to set client certificate");
            X509_free((X509 *)params.cert);
            return CURLE_SSL_CERTPROBLEM;
          }
          X509_free((X509 *)params.cert);
          bVar61 = true;
        }
        else {
          if (iVar9 != 1) {
            pcVar48 = "not supported file type \'%s\' for certificate";
            pCVar32 = local_c18;
            goto LAB_003b8acf;
          }
          iVar9 = SSL_CTX_use_certificate_chain_file(pSVar20,(char *)local_c60);
          bVar61 = true;
          if (iVar9 != 1) {
            uVar21 = ERR_get_error();
            ERR_error_string_n(uVar21,error_buffer_1,0x100);
            pcVar48 = 
            "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
            ;
            goto LAB_003b8acc;
          }
        }
LAB_003b87fa:
        iVar9 = do_file_type(local_bc8);
        if (iVar9 == 0x2b) {
          if (bVar61) {
            pcVar48 = "file type P12 for private key not supported";
            goto LAB_003b9d16;
          }
        }
        else {
          pCVar32 = local_be8;
          if (iVar9 == 2) {
LAB_003b8b3d:
            iVar9 = SSL_CTX_use_PrivateKey_file(pSVar20,(char *)pCVar32,iVar9);
            if (iVar9 != 1) {
              pcVar48 = "PEM";
              if (local_bc8 != (char *)0x0) {
                pcVar48 = local_bc8;
              }
              pcVar17 = "unable to set private key file: \'%s\' type %s";
LAB_003b8d5e:
              Curl_failf(pCVar53,pcVar17,pCVar32,pcVar48);
              return CURLE_SSL_CERTPROBLEM;
            }
          }
          else if (iVar9 == 0x2a) {
            if ((pCVar53->state).engine == (void *)0x0) {
              _Var8 = is_pkcs11_uri((char *)local_be8);
              if ((_Var8) && (CVar11 = Curl_ossl_set_engine(pCVar53,"pkcs11"), CVar11 != CURLE_OK))
              {
                return CURLE_SSL_CERTPROBLEM;
              }
              if ((pCVar53->state).engine == (void *)0x0) {
                pcVar48 = "crypto engine not set, can\'t load private key";
                goto LAB_003b9d16;
              }
            }
            method = UI_create_method("curl user interface");
            if (method == (UI_METHOD *)0x0) {
              pcVar48 = "unable do create OpenSSL user-interface method";
              goto LAB_003b9d16;
            }
            pUVar36 = UI_OpenSSL();
            iVar9 = UI_method_get_opener((UI *)pUVar36);
            UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar9));
            pUVar36 = UI_OpenSSL();
            iVar9 = UI_method_get_closer((UI *)pUVar36);
            UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar9));
            UI_method_set_reader(method,ssl_ui_reader);
            UI_method_set_writer(method,ssl_ui_writer);
            pEVar38 = ENGINE_load_private_key
                                ((ENGINE *)(pCVar53->state).engine,(char *)local_be8,method,pcVar48)
            ;
            UI_destroy_method(method);
            if (pEVar38 == (EVP_PKEY *)0x0) {
              pcVar48 = "failed to load private key from crypto engine";
              pCVar53 = local_c50;
              goto LAB_003b9d16;
            }
            iVar9 = SSL_CTX_use_PrivateKey(pSVar20,pEVar38);
            if (iVar9 != 1) {
              Curl_failf(local_c50,"unable to set private key");
              EVP_PKEY_free(pEVar38);
              return CURLE_SSL_CERTPROBLEM;
            }
            EVP_PKEY_free(pEVar38);
          }
          else {
            if (iVar9 != 1) {
              pcVar48 = "not supported file type for private key";
              goto LAB_003b9d16;
            }
            if (bVar61) {
              if (local_be8 == (Curl_easy *)0x0) {
                pCVar32 = local_c60;
              }
              goto LAB_003b8b3d;
            }
          }
        }
        pSVar37 = SSL_new(pSVar20);
        if (pSVar37 == (SSL *)0x0) {
          pcVar48 = "unable to create an SSL structure";
          pCVar53 = local_c50;
          goto LAB_003b9d16;
        }
        x509 = (X509 *)SSL_get_certificate(pSVar37);
        if ((X509 *)x509 != (X509 *)0x0) {
          pEVar38 = X509_get_pubkey((X509 *)x509);
          peVar39 = SSL_get_privatekey(pSVar37);
          EVP_PKEY_copy_parameters(pEVar38,peVar39);
          EVP_PKEY_free(pEVar38);
        }
        peVar39 = SSL_get_privatekey(pSVar37);
        iVar9 = EVP_PKEY_get_id(peVar39);
        if (iVar9 == 6) {
          r = EVP_PKEY_get1_RSA(peVar39);
          uVar14 = RSA_flags(r);
          RSA_free(r);
          SSL_free(pSVar37);
          pXVar35 = local_c30;
          if ((uVar14 & 1) != 0) goto LAB_003b8dab;
        }
        else {
          SSL_free(pSVar37);
        }
        iVar9 = SSL_CTX_check_private_key(pSVar20);
        pXVar35 = local_c30;
        if (iVar9 == 0) {
          pcVar48 = "Private key does not match the certificate public key";
          pCVar53 = local_c50;
LAB_003b9d16:
          Curl_failf(pCVar53,pcVar48);
          return CURLE_SSL_CERTPROBLEM;
        }
      }
    }
LAB_003b8dab:
    cVar10 = (conn->http_proxy).proxytype;
    if ((cVar10 != CURLPROXY_HTTPS) ||
       (lVar59 = 0x380, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar59 = 0x330;
    }
    pcVar48 = *(char **)((conn->chunk).hexbuffer + lVar59 + -0x20);
    if (pcVar48 != (char *)0x0) {
      iVar9 = SSL_CTX_set_cipher_list
                        ((SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),pcVar48
                        );
      if (iVar9 == 0) {
        pcVar17 = "failed setting cipher list: %s";
        goto LAB_003b8f1d;
      }
      Curl_infof(pCVar52,"Cipher selection: %s\n",pcVar48);
      cVar10 = (conn->http_proxy).proxytype;
    }
    if ((cVar10 != CURLPROXY_HTTPS) ||
       (lVar59 = 0x388, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar59 = 0x338;
    }
    pcVar48 = *(char **)((conn->chunk).hexbuffer + lVar59 + -0x20);
    if (pcVar48 != (char *)0x0) {
      iVar9 = SSL_CTX_set_ciphersuites
                        (**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),pcVar48);
      if (iVar9 == 0) {
        pcVar17 = "failed setting TLS 1.3 cipher suite: %s";
LAB_003b8f1d:
        Curl_failf(pCVar52,pcVar17,pcVar48);
        return CURLE_SSL_CIPHER;
      }
      Curl_infof(pCVar52,"TLS 1.3 cipher selection: %s\n",pcVar48);
    }
    iVar9 = 1;
    SSL_CTX_set_post_handshake_auth(**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),1);
    pXVar60 = local_bd8;
    if (local_bd8 != (X509 *)0x0 || local_c10 != (stack_st_X509 *)0x0) {
      iVar12 = SSL_CTX_load_verify_locations
                         ((SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),
                          (char *)local_bd8,(char *)local_c10);
      if ((local_bec != 0) && (iVar12 == 0)) {
        if (pXVar60 == (X509 *)0x0) {
          pXVar60 = (X509 *)0x4357b3;
        }
        psVar24 = (stack_st_X509 *)0x4357b3;
        if (local_c10 != (stack_st_X509 *)0x0) {
          psVar24 = local_c10;
        }
        Curl_failf(pCVar52,"error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s"
                   ,pXVar60,psVar24);
        return CURLE_SSL_CACERT_BADFILE;
      }
      pcVar48 = "error setting certificate verify locations, continuing anyway:\n";
      if (iVar12 != 0) {
        pcVar48 = "successfully set certificate verify locations:\n";
      }
      Curl_infof(pCVar52,pcVar48);
      if (pXVar60 == (X509 *)0x0) {
        pXVar60 = (X509 *)0x4357b3;
      }
      psVar24 = (stack_st_X509 *)0x4357b3;
      if (local_c10 != (stack_st_X509 *)0x0) {
        psVar24 = local_c10;
      }
      Curl_infof(pCVar52,"  CAfile: %s\n  CApath: %s\n",pXVar60,psVar24);
    }
    if (local_c20 != (Curl_easy *)0x0) {
      pXVar42 = SSL_CTX_get_cert_store
                          ((SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4));
      m = X509_LOOKUP_file();
      pCVar32 = local_c20;
      ctx = X509_STORE_add_lookup(pXVar42,m);
      if ((ctx == (X509_LOOKUP *)0x0) ||
         (iVar12 = X509_load_crl_file(ctx,(char *)pCVar32,1), iVar12 == 0)) {
        Curl_failf(pCVar52,"error loading CRL file: %s",pCVar32);
        return CURLE_SSL_CRL_BADFILE;
      }
      Curl_infof(pCVar52,"successfully load CRL file:\n");
      pXVar42 = SSL_CTX_get_cert_store
                          ((SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4));
      X509_STORE_set_flags(pXVar42,0xc);
      Curl_infof(pCVar52,"  CRLfile: %s\n",pCVar32);
    }
    SSL_CTX_set_verify((SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),local_bec
                       ,(callback *)0x0);
    if (keylog_file_fp != (FILE *)0x0) {
      SSL_CTX_set_keylog_callback
                (**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),ossl_keylog_callback);
    }
    p_Var3 = (pCVar52->set).ssl.fsslctx;
    if ((p_Var3 != (curl_ssl_ctx_callback)0x0) &&
       (CVar11 = (*p_Var3)(pCVar52,(void *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4),
                           (pCVar52->set).ssl.fsslctxp), CVar11 != CURLE_OK)) {
      pcVar48 = "error signaled by ssl ctx callback";
      goto LAB_003b7591;
    }
    puVar40 = *(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4);
    if ((SSL *)puVar40[1] != (SSL *)0x0) {
      SSL_free((SSL *)puVar40[1]);
      puVar40 = *(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4);
    }
    pSVar37 = SSL_new((SSL_CTX *)*puVar40);
    *(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8) = pSVar37;
    if (pSVar37 == (SSL *)0x0) {
      Curl_failf(pCVar52,"SSL: couldn\'t create a context (handle)!");
      return CURLE_OUT_OF_MEMORY;
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_003b90fe:
        SSL_ctrl(pSVar37,0x41,1,(void *)0x0);
        pSVar37 = *(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8);
      }
    }
    else if ((conn->ssl_config).verifystatus == true) goto LAB_003b90fe;
    SSL_set_connect_state(pSVar37);
    pBVar25 = local_c38;
    *(undefined8 *)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10) = 0;
    iVar12 = inet_pton(2,(char *)local_c38,&addr);
    if (((iVar12 == 0) && (iVar12 = inet_pton(10,(char *)pBVar25,&addr), iVar12 == 0)) &&
       (lVar59 = SSL_ctrl(*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8),0x37,0,
                          pBVar25), lVar59 == 0)) {
      Curl_infof(pCVar52,"WARNING: failed to configure server name indication (SNI) TLS extension\n"
                );
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      if ((pCVar52->set).proxy_ssl.primary.sessionid != false) {
LAB_003b91f4:
        error_buffer_1[0] = '\0';
        error_buffer_1[1] = '\0';
        error_buffer_1[2] = '\0';
        error_buffer_1[3] = '\0';
        error_buffer_1[4] = '\0';
        error_buffer_1[5] = '\0';
        error_buffer_1[6] = '\0';
        error_buffer_1[7] = '\0';
        Curl_ssl_sessionid_lock(conn);
        _Var8 = Curl_ssl_getsessionid(conn,(void **)error_buffer_1,(size_t *)0x0,sockindex);
        if (!_Var8) {
          iVar12 = SSL_set_session(*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8),
                                   (SSL_SESSION *)CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]));
          if (iVar12 == 0) {
            Curl_ssl_sessionid_unlock(conn);
            uVar21 = ERR_get_error();
            ERR_error_string_n(uVar21,error_buffer,0x100);
            pcVar48 = "SSL: SSL_set_session failed: %s";
            goto LAB_003b9351;
          }
          Curl_infof(pCVar52,"SSL re-using session ID\n");
        }
        Curl_ssl_sessionid_unlock(conn);
      }
    }
    else if ((pCVar52->set).ssl.primary.sessionid == true) goto LAB_003b91f4;
    if (*(_Bool *)((long)&pXVar35->cert_info + (long)&conn->proxy_ssl[0].use) == true) {
      pBVar23 = BIO_f_ssl();
      pBVar25 = BIO_new(pBVar23);
      BIO_ctrl(pBVar25,0x6d,0,
               *(void **)(*(long *)(pXVar35[3].sha1_hash + (long)(&conn->chunk + -2) + 8) + 8));
      SSL_set_bio(*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8),pBVar25,pBVar25);
    }
    else {
      iVar12 = SSL_set_fd(*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8),local_c64)
      ;
      if (iVar12 == 0) {
        uVar21 = ERR_get_error();
        ERR_error_string_n(uVar21,error_buffer,0x100);
        pcVar48 = "SSL: SSL_set_fd failed: %s";
LAB_003b9351:
        Curl_failf(pCVar52,pcVar48,error_buffer);
        return CURLE_SSL_CONNECT_ERROR;
      }
    }
    *(undefined4 *)((long)&pXVar57[3].valid + (long)pCVar4) = 1;
    pCVar32 = local_bf8;
    done = local_be0;
    lVar59 = local_bd0;
  }
  local_c48 = (Curl_easy *)CONCAT44(local_c48._4_4_,sockindex);
  local_be0 = done;
  local_bd0 = lVar59;
  while (iVar9 - 1U < 3) {
    timeout_ms = Curl_timeleft(pCVar32,(curltime *)0x0,true);
    if (timeout_ms < 0) goto LAB_003b7084;
    uVar14 = *(uint *)((long)&pXVar57[3].valid + (long)pCVar4);
    if ((uVar14 & 0xfffffffe) == 2) {
      writefd = -1;
      if (uVar14 == 3) {
        writefd = (int)local_c58;
      }
      readfd0 = -1;
      if (uVar14 == 2) {
        readfd0 = (int)local_c58;
      }
      if ((byte)local_c28 != '\0') {
        timeout_ms = 0;
      }
      iVar9 = Curl_socket_check(readfd0,-1,writefd,timeout_ms);
      if (iVar9 < 0) {
        puVar19 = (uint *)__errno_location();
        Curl_failf(pCVar32,"select/poll on SSL socket, errno: %d",(ulong)*puVar19);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar9 == 0) {
        if ((byte)local_c28 != '\0') {
          *local_be0 = false;
          return CURLE_OK;
        }
        goto LAB_003b7084;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar59 = 0xb60, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar59 = 0xab0;
    }
    pCVar52 = conn->data;
    ERR_clear_error();
    iVar9 = SSL_connect(*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8));
    if (iVar9 == 1) {
      *(undefined4 *)((long)&pXVar57[3].valid + (long)pCVar4) = 4;
      pSVar37 = *(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8);
      pcVar48 = "";
      if (pSVar37 != (SSL *)0x0) {
        iVar9 = SSL_version(pSVar37);
        pcVar48 = "TLSv1.3";
        switch(iVar9) {
        case 0x300:
          pcVar48 = "SSLv3";
          break;
        case 0x301:
          pcVar48 = "TLSv1.0";
          break;
        case 0x302:
          pcVar48 = "TLSv1.1";
          break;
        case 0x303:
          pcVar48 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar9 == 2) {
            pcVar48 = "SSLv2";
          }
          else {
            pcVar48 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher(*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8));
      pcVar17 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar52,"SSL connection using %s / %s\n",pcVar48,pcVar17);
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected
                  (*(undefined8 *)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8),
                   error_buffer_1,error_buffer);
        if (error_buffer._0_4_ == 0) {
          Curl_infof(pCVar52,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar52,"ALPN, server accepted to use %.*s\n",error_buffer._0_8_ & 0xffffffff,
                     CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]));
          if ((error_buffer._0_4_ == 8) &&
             (*(long *)CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]) == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
      }
    }
    else {
      iVar9 = SSL_get_error(*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8),iVar9);
      if (iVar9 == 3) {
        *(undefined4 *)((long)&pXVar57[3].valid + (long)pCVar4) = 3;
      }
      else {
        if (iVar9 != 2) {
          memset(error_buffer_1,0,0x100);
          *(undefined4 *)((long)&pXVar57[3].valid + (long)pCVar4) = 1;
          uVar21 = ERR_get_error();
          uVar14 = (uint)uVar21;
          if (((-1 < (int)uVar14) && ((uVar14 & 0xff800000) == 0xa000000)) &&
             ((uVar14 & 0x7fffff) == 0x86)) {
            lVar22 = SSL_get_verify_result
                               (*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8));
            if (lVar22 == 0) {
              builtin_strncpy(error_buffer_1,"SSL certificate verification failed",0x24);
            }
            else {
              *(long *)((long)pCVar52->sockets + lVar59 + -0x80) = lVar22;
              pcVar48 = X509_verify_cert_error_string(lVar22);
              curl_msnprintf(error_buffer_1,0x100,"SSL certificate problem: %s",pcVar48);
            }
            CVar11 = CURLE_PEER_FAILED_VERIFICATION;
LAB_003b7618:
            Curl_failf(pCVar52,"%s",error_buffer_1);
            return CVar11;
          }
          ERR_error_string_n(uVar21,error_buffer_1,0x100);
          if (uVar21 != 0) {
            CVar11 = CURLE_SSL_CONNECT_ERROR;
            goto LAB_003b7618;
          }
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar61 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            ppVar5 = &conn->http_proxy;
            if (bVar61) {
              ppVar5 = (proxy_info *)&conn->host;
            }
            pcVar48 = (ppVar5->host).name;
            if (!bVar61) {
              lVar59 = conn->port;
              goto LAB_003b84bb;
            }
          }
          else {
            pcVar48 = (conn->host).name;
          }
          lVar59 = (long)conn->remote_port;
LAB_003b84bb:
          pcVar17 = SSL_ERROR_to_str(iVar9);
          Curl_failf(pCVar52,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar17,pcVar48,
                     lVar59);
          return CURLE_SSL_CONNECT_ERROR;
        }
        *(undefined4 *)((long)&pXVar57[3].valid + (long)pCVar4) = 2;
      }
    }
    iVar9 = *(int *)((long)&pXVar57[3].valid + (long)pCVar4);
    if (((byte)local_c28 != '\0') && (iVar9 - 1U < 3)) {
      return CURLE_OK;
    }
  }
  if (iVar9 == 4) {
    pCVar52 = conn->data;
    cVar10 = (conn->http_proxy).proxytype;
    iVar9 = (int)local_c48;
    if ((cVar10 == CURLPROXY_HTTPS) &&
       (iVar12 = conn->sock[1], conn->proxy_ssl[iVar12 != -1].state != ssl_connection_complete)) {
      if ((pCVar52->set).proxy_ssl.primary.sessionid != false) {
LAB_003b74ee:
        error_buffer_1[0] = '\0';
        error_buffer_1[1] = '\0';
        error_buffer_1[2] = '\0';
        error_buffer_1[3] = '\0';
        error_buffer_1[4] = '\0';
        error_buffer_1[5] = '\0';
        error_buffer_1[6] = '\0';
        error_buffer_1[7] = '\0';
        ses = SSL_get1_session(*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8));
        Curl_ssl_sessionid_lock(conn);
        _Var8 = Curl_ssl_getsessionid(conn,(void **)error_buffer_1,(size_t *)0x0,iVar9);
        if ((_Var8) || ((SSL_SESSION *)CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]) == ses)) {
          if (_Var8) goto LAB_003b7560;
          SSL_SESSION_free(ses);
        }
        else {
          Curl_infof(pCVar52,"old SSL session ID is stale, removing\n");
          Curl_ssl_delsessionid(conn,(void *)CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]));
LAB_003b7560:
          CVar11 = Curl_ssl_addsessionid(conn,ses,0,iVar9);
          if (CVar11 != CURLE_OK) {
            Curl_ssl_sessionid_unlock(conn);
            pcVar48 = "failed to store ssl session";
LAB_003b7591:
            Curl_failf(pCVar52,pcVar48);
            return CVar11;
          }
        }
        Curl_ssl_sessionid_unlock(conn);
        cVar10 = (conn->http_proxy).proxytype;
        goto LAB_003b76a6;
      }
LAB_003b76b5:
      pCVar32 = conn->data;
      if (conn->proxy_ssl[iVar12 != -1].state == ssl_connection_complete) {
        if ((conn->ssl_config).verifypeer == true) goto LAB_003b772d;
        bVar61 = true;
        lVar59 = 0x301;
LAB_003b7758:
        local_c64 = CONCAT31(local_c64._1_3_,(conn->chunk).hexbuffer[lVar59 + -0x20]);
        memset(&params,0,0x100);
        if (!bVar61) {
          local_bf8 = (Curl_easy *)0xab0;
          goto LAB_003b77ba;
        }
        iVar12 = conn->sock[1];
      }
      else {
        if ((conn->proxy_ssl_config).verifypeer != true) {
          bVar61 = true;
          lVar59 = 0x351;
          goto LAB_003b7758;
        }
LAB_003b772d:
        memset(&params,0,0x100);
        local_c64 = CONCAT31(local_c64._1_3_,1);
      }
      local_bf8 = (Curl_easy *)0xb60;
      if (conn->proxy_ssl[iVar12 != -1].state == ssl_connection_complete) {
        local_bf8 = (Curl_easy *)0xab0;
      }
    }
    else {
      if ((pCVar52->set).ssl.primary.sessionid == true) goto LAB_003b74ee;
LAB_003b76a6:
      if (cVar10 == CURLPROXY_HTTPS) {
        iVar12 = conn->sock[1];
        goto LAB_003b76b5;
      }
      pCVar32 = conn->data;
      if ((conn->ssl_config).verifypeer != true) {
        lVar59 = 0x301;
        bVar61 = false;
        goto LAB_003b7758;
      }
      memset(&params,0,0x100);
      local_bf8 = (Curl_easy *)0xab0;
      local_c64 = CONCAT31(local_c64._1_3_,1);
    }
LAB_003b77ba:
    pBVar23 = BIO_s_mem();
    local_c38 = BIO_new(pBVar23);
    if ((pCVar32->set).ssl.certinfo == true) {
      pCVar52 = conn->data;
      psVar24 = SSL_get_peer_cert_chain
                          (*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8));
      if (psVar24 != (stack_st_X509 *)0x0) {
        iVar9 = OPENSSL_sk_num(psVar24);
        CVar11 = Curl_ssl_init_certinfo(pCVar52,iVar9);
        if (CVar11 == CURLE_OK) {
          local_c20 = pCVar32;
          local_c10 = psVar24;
          pBVar23 = BIO_s_mem();
          pBVar25 = BIO_new(pBVar23);
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          local_c18 = (Curl_easy *)CONCAT44(local_c18._4_4_,iVar9);
          local_c48 = pCVar52;
          local_c28 = pBVar25;
          for (iVar9 = 0; iVar9 != (int)local_c18; iVar9 = iVar9 + 1) {
            local_c30 = (X509 *)OPENSSL_sk_value(local_c10,iVar9);
            psig = (ASN1_BIT_STRING *)0x0;
            pXVar26 = X509_get_subject_name(local_c30);
            X509_NAME_print_ex(pBVar25,pXVar26,0,0x82031f);
            sVar27 = BIO_ctrl(pBVar25,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar52,iVar9,"Subject",ptr,sVar27);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
            pXVar35 = local_c30;
            pXVar26 = X509_get_issuer_name(local_c30);
            X509_NAME_print_ex(pBVar25,pXVar26,0,0x82031f);
            sVar27 = BIO_ctrl(pBVar25,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar52,iVar9,"Issuer",ptr,sVar27);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
            uVar28 = X509_get_version(pXVar35);
            BIO_printf(pBVar25,"%lx",uVar28);
            sVar27 = BIO_ctrl(pBVar25,3,0,&ptr);
            local_c58 = (BIO *)CONCAT44(local_c58._4_4_,iVar9);
            Curl_ssl_push_certinfo_len(pCVar52,iVar9,"Version",ptr,sVar27);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
            pAVar29 = X509_get_serialNumber(pXVar35);
            if (pAVar29->type == 0x102) {
              BIO_puts(pBVar25,"-");
            }
            for (lVar59 = 0; pBVar25 = local_c28, lVar59 < pAVar29->length; lVar59 = lVar59 + 1) {
              BIO_printf(local_c28,"%02x",(ulong)pAVar29->data[lVar59]);
            }
            sVar27 = BIO_ctrl(local_c28,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar52,(int)local_c58,"Serial Number",ptr,sVar27);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
            palg = (X509_ALGOR *)0x0;
            pAVar30 = ASN1_STRING_new();
            if (pAVar30 != (ASN1_STRING *)0x0) {
              X509_get0_signature(&psig,&palg,local_c30);
              X509_signature_print(pBVar25,(X509_ALGOR *)palg,pAVar30);
              ASN1_STRING_free(pAVar30);
              if (palg != (X509_ALGOR *)0x0) {
                i2a_ASN1_OBJECT(pBVar25,(ASN1_OBJECT *)palg->algorithm);
                sVar27 = BIO_ctrl(pBVar25,3,0,&ptr);
                Curl_ssl_push_certinfo_len(pCVar52,(int)local_c58,"Public Key Algorithm",ptr,sVar27)
                ;
                BIO_ctrl(pBVar25,1,0,(void *)0x0);
              }
            }
            uVar28 = X509_get0_extensions(local_c30);
            iVar9 = OPENSSL_sk_num(uVar28);
            if (0 < iVar9) {
              for (iVar9 = 0; iVar12 = OPENSSL_sk_num(uVar28), iVar9 < iVar12; iVar9 = iVar9 + 1) {
                ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar28,iVar9);
                pBVar23 = BIO_s_mem();
                pBVar25 = BIO_new(pBVar23);
                if (pBVar25 == (BIO *)0x0) break;
                a = X509_EXTENSION_get_object(ex);
                i2t_ASN1_OBJECT((char *)&addr,0x80,a);
                iVar12 = X509V3_EXT_print(pBVar25,ex,0,0);
                if (iVar12 == 0) {
                  v = X509_EXTENSION_get_data(ex);
                  ASN1_STRING_print(pBVar25,v);
                }
                BIO_ctrl(pBVar25,0x73,0,&x509);
                pcVar48 = error_buffer;
                uVar21 = 0;
                while (pCVar52 = local_c48, uVar50 = *(ulong *)x509, uVar21 < uVar50) {
                  bVar61 = *(char *)(*(long *)(x509 + 8) + uVar21) == '\n';
                  pcVar17 = "";
                  if (bVar61) {
                    pcVar17 = ", ";
                  }
                  uVar21 = uVar21 + bVar61;
                  if (uVar50 <= uVar21) {
                    uVar50 = uVar21;
                  }
                  for (; uVar50 != uVar21; uVar21 = uVar21 + 1) {
                    if (*(char *)(*(long *)(x509 + 8) + uVar21) != ' ') {
                      iVar12 = curl_msnprintf(pcVar48,(size_t)(error_buffer_1 + -(long)pcVar48),
                                              "%s%c",pcVar17);
                      pcVar48 = pcVar48 + iVar12;
                      uVar50 = uVar21;
                      break;
                    }
                  }
                  uVar21 = uVar50 + 1;
                }
                Curl_ssl_push_certinfo(local_c48,(int)local_c58,(char *)&addr,error_buffer);
                BIO_free(pBVar25);
              }
            }
            pXVar35 = local_c30;
            pAVar31 = (ASN1_TIME *)X509_get0_notBefore(local_c30);
            pBVar25 = local_c28;
            ASN1_TIME_print(local_c28,pAVar31);
            sVar27 = BIO_ctrl(pBVar25,3,0,&ptr);
            iVar9 = (int)local_c58;
            Curl_ssl_push_certinfo_len(pCVar52,(int)local_c58,"Start date",ptr,sVar27);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
            pAVar31 = (ASN1_TIME *)X509_get0_notAfter(pXVar35);
            ASN1_TIME_print(pBVar25,pAVar31);
            sVar27 = BIO_ctrl(pBVar25,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar52,iVar9,"Expire date",ptr,sVar27);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
            pCVar32 = (Curl_easy *)X509_get_pubkey(pXVar35);
            if (pCVar32 == (Curl_easy *)0x0) {
              Curl_infof(pCVar52,"   Unable to load public key\n");
            }
            else {
              local_c60 = pCVar32;
              iVar12 = EVP_PKEY_get_id(pCVar32);
              pCVar32 = local_c60;
              if (iVar12 == 0x74) {
                uVar28 = EVP_PKEY_get0_DSA(local_c60);
                DSA_get0_pqg(uVar28,error_buffer,&addr,&x509);
                DSA_get0_key(uVar28,&palg,0);
                pcVar48 = "dsa";
LAB_003b7e8a:
                pubkey_show(pCVar52,(BIO *)pBVar25,(int)local_c58,pcVar48,"p",
                            (BIGNUM *)error_buffer._0_8_);
                pubkey_show(pCVar52,(BIO *)pBVar25,(int)local_c58,pcVar48,"q",
                            (BIGNUM *)addr.__in6_u._0_8_);
                pubkey_show(pCVar52,(BIO *)pBVar25,(int)local_c58,pcVar48,"g",(BIGNUM *)x509);
                iVar9 = (int)local_c58;
                pubkey_show(pCVar52,(BIO *)pBVar25,(int)local_c58,pcVar48,"pub_key",(BIGNUM *)palg);
              }
              else {
                if (iVar12 == 0x1c) {
                  uVar28 = EVP_PKEY_get0_DH(local_c60);
                  DH_get0_pqg(uVar28,error_buffer,&addr,&x509);
                  DH_get0_key(uVar28,&palg,0);
                  pcVar48 = "dh";
                  goto LAB_003b7e8a;
                }
                if (iVar12 == 6) {
                  uVar28 = EVP_PKEY_get0_RSA(local_c60);
                  RSA_get0_key(uVar28,error_buffer,&addr,0);
                  BN_print(pBVar25,(BIGNUM *)error_buffer._0_8_);
                  sVar27 = BIO_ctrl(pBVar25,3,0,&ptr);
                  Curl_ssl_push_certinfo_len(pCVar52,iVar9,"RSA Public Key",ptr,sVar27);
                  BIO_ctrl(pBVar25,1,0,(void *)0x0);
                  pubkey_show(pCVar52,(BIO *)pBVar25,iVar9,"rsa","n",(BIGNUM *)error_buffer._0_8_);
                  iVar9 = (int)local_c58;
                  pubkey_show(pCVar52,(BIO *)pBVar25,(int)local_c58,"rsa","e",
                              (BIGNUM *)addr.__in6_u._0_8_);
                  pCVar32 = local_c60;
                }
              }
              EVP_PKEY_free((EVP_PKEY *)pCVar32);
            }
            if (psig != (ASN1_BIT_STRING *)0x0) {
              for (lVar59 = 0; lVar59 < psig->length; lVar59 = lVar59 + 1) {
                BIO_printf(pBVar25,"%02x:",(ulong)psig->data[lVar59]);
              }
              sVar27 = BIO_ctrl(pBVar25,3,0,&ptr);
              iVar9 = (int)local_c58;
              Curl_ssl_push_certinfo_len(pCVar52,(int)local_c58,"Signature",ptr,sVar27);
              BIO_ctrl(pBVar25,1,0,(void *)0x0);
            }
            PEM_write_bio_X509(pBVar25,local_c30);
            sVar27 = BIO_ctrl(pBVar25,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar52,iVar9,"Cert",ptr,sVar27);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
          }
          BIO_free(pBVar25);
          pCVar32 = local_c20;
        }
      }
    }
    pBVar23 = BIO_s_file();
    pBVar25 = BIO_new(pBVar23);
    if (pBVar25 == (BIO *)0x0) {
      uVar21 = ERR_get_error();
      ERR_error_string_n(uVar21,(char *)&params,0x100);
      Curl_failf(pCVar32,"BIO_new return NULL, OpenSSL error %s",&params);
      BIO_free(local_c38);
      return CURLE_OUT_OF_MEMORY;
    }
    lVar59 = SSL_get1_peer_certificate
                       (*(undefined8 *)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8));
    *(long *)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10) = lVar59;
    if (lVar59 == 0) {
      BIO_free(pBVar25);
      BIO_free(local_c38);
      if ((char)local_c64 != '\0') {
        Curl_failf(pCVar32,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar48 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar48 = "Server";
        }
      }
      else {
        pcVar48 = "Server";
      }
      local_c48 = (Curl_easy *)pBVar25;
      Curl_infof(pCVar32,"%s certificate:\n",pcVar48);
      pXVar26 = X509_get_subject_name
                          (*(X509 **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10));
      iVar9 = x509_name_oneline((X509_NAME *)pXVar26,error_buffer_1,size);
      pcVar48 = "[NONE]";
      if (iVar9 == 0) {
        pcVar48 = error_buffer_1;
      }
      Curl_infof(pCVar32," subject: %s\n",pcVar48);
      pAVar31 = (ASN1_TIME *)
                X509_get0_notBefore(*(undefined8 *)
                                     (*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10));
      pBVar25 = local_c38;
      ASN1_TIME_print(local_c38,pAVar31);
      lVar59 = BIO_ctrl(pBVar25,3,0,&local_bc0);
      Curl_infof(pCVar32," start date: %.*s\n",lVar59);
      BIO_ctrl(pBVar25,1,0,(void *)0x0);
      pAVar31 = (ASN1_TIME *)
                X509_get0_notAfter(*(undefined8 *)
                                    (*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10));
      ASN1_TIME_print(pBVar25,pAVar31);
      lVar59 = BIO_ctrl(pBVar25,3,0,&local_bc0);
      Curl_infof(pCVar32," expire date: %.*s\n",lVar59);
      BIO_ctrl(pBVar25,1,0,(void *)0x0);
      BIO_free(pBVar25);
      cVar10 = (conn->http_proxy).proxytype;
      if ((cVar10 == CURLPROXY_HTTPS) &&
         (iVar9 = conn->sock[1], conn->proxy_ssl[iVar9 != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifyhost == true) {
          pXVar35 = *(X509 **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10);
          local_c60 = conn->data;
LAB_003b8475:
          bVar61 = conn->proxy_ssl[iVar9 != -1].state == ssl_connection_complete;
          ppVar5 = &conn->http_proxy;
          if (bVar61) {
            ppVar5 = (proxy_info *)&conn->host;
          }
          ppcVar33 = &(ppVar5->host).name;
          lVar59 = 0x160;
          if (bVar61) {
            lVar59 = 0xd8;
          }
LAB_003b84ed:
          psVar24 = (stack_st_X509 *)*ppcVar33;
          local_c18 = *(Curl_easy **)((conn->chunk).hexbuffer + lVar59 + -0x20);
          local_c10 = psVar24;
          if (((conn->bits).ipv6_ip == true) &&
             (iVar9 = inet_pton(10,(char *)psVar24,error_buffer), iVar9 != 0)) {
            iVar9 = 7;
            pXVar60 = (X509 *)&DAT_00000010;
          }
          else {
            iVar9 = inet_pton(2,(char *)psVar24,error_buffer);
            pXVar60 = (X509 *)(ulong)((uint)(iVar9 != 0) * 4);
            iVar9 = (uint)(iVar9 != 0) * 5 + 2;
          }
          pBVar25 = (BIO *)0x0;
          local_bd8 = pXVar35;
          a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar35,0x55,(int *)0x0,(int *)0x0);
          if (a_00 == (GENERAL_NAMES *)0x0) {
LAB_003b8702:
            addr.__in6_u._0_8_ = (long)"PK\x01\x02" + 4;
            pXVar26 = X509_get_subject_name(local_bd8);
            if (pXVar26 == (X509_NAME *)0x0) {
LAB_003b938a:
              if ((char *)addr.__in6_u._0_8_ == "") {
                addr.__in6_u._0_8_ = 0;
                goto LAB_003b93de;
              }
              if (addr.__in6_u._0_8_ == 0) goto LAB_003b93de;
              iVar9 = Curl_cert_hostcheck((char *)addr.__in6_u._0_8_,(char *)local_c10);
              if (iVar9 == 0) {
                Curl_failf(local_c60,
                           "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                           ,addr.__in6_u._0_8_,local_c18);
                goto LAB_003b93f1;
              }
              CVar11 = CURLE_OK;
              Curl_infof(local_c60," common name: %s (matched)\n");
            }
            else {
              iVar9 = -1;
              do {
                iVar12 = iVar9;
                iVar9 = X509_NAME_get_index_by_NID(pXVar26,0xd,iVar12);
              } while (-1 < iVar9);
              if (iVar12 < 0) goto LAB_003b938a;
              ne = X509_NAME_get_entry(pXVar26,iVar12);
              pAVar30 = X509_NAME_ENTRY_get_data(ne);
              if (pAVar30 == (ASN1_STRING *)0x0) goto LAB_003b938a;
              iVar9 = ASN1_STRING_type(pAVar30);
              if (iVar9 == 0xc) {
                uVar14 = ASN1_STRING_length(pAVar30);
                if ((int)uVar14 < 0) {
                  uVar28 = "";
                }
                else {
                  uVar28 = CRYPTO_malloc(uVar14 + 1,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                         ,0x63e);
                  addr.__in6_u._0_8_ = uVar28;
                  if ((char *)uVar28 == (char *)0x0) goto LAB_003b93de;
                  __src = (void *)ASN1_STRING_get0_data(pAVar30);
                  memcpy((void *)uVar28,__src,(ulong)uVar14);
                  *(char *)(uVar28 + (ulong)uVar14) = '\0';
                }
LAB_003b9372:
                uznum = strlen((char *)uVar28);
                uVar15 = curlx_uztosi(uznum);
                if (uVar15 == uVar14) goto LAB_003b938a;
                Curl_failf(local_c60,"SSL: illegal cert name field");
                if ((char *)addr.__in6_u._0_8_ == "") goto LAB_003b86f9;
                CVar11 = CURLE_PEER_FAILED_VERIFICATION;
                goto LAB_003b9401;
              }
              uVar14 = ASN1_STRING_to_UTF8((uchar **)&addr,pAVar30);
              uVar28 = addr.__in6_u._0_8_;
              if (addr.__in6_u._0_8_ != 0) goto LAB_003b9372;
LAB_003b93de:
              Curl_failf(local_c60,"SSL: unable to obtain common name from peer certificate");
LAB_003b93f1:
              CVar11 = CURLE_PEER_FAILED_VERIFICATION;
            }
LAB_003b9401:
            if (addr.__in6_u._0_8_ != 0) {
              CRYPTO_free((void *)addr.__in6_u._0_8_);
            }
            if (CVar11 == CURLE_OK) goto LAB_003b9441;
          }
          else {
            local_c30 = pXVar60;
            local_c20 = pCVar32;
            iVar12 = OPENSSL_sk_num(a_00);
            iVar58 = 0;
            bVar61 = false;
            local_c38 = (BIO *)0x0;
            local_c28 = (BIO *)0x0;
            local_c58 = (BIO *)0x0;
            while ((iVar58 < iVar12 && (!bVar61))) {
              piVar34 = (int *)OPENSSL_sk_value(a_00,iVar58);
              iVar13 = *piVar34;
              uVar45 = (undefined7)((ulong)pBVar25 >> 8);
              if (iVar13 == 2) {
                pBVar25 = (BIO *)CONCAT71(uVar45,1);
                local_c58 = pBVar25;
              }
              else if (iVar13 == 7) {
                pBVar25 = (BIO *)CONCAT71(uVar45,1);
                local_c28 = pBVar25;
              }
              if (iVar13 == iVar9) {
                __s = (BIO *)ASN1_STRING_get0_data(*(undefined8 *)(piVar34 + 2));
                iVar13 = ASN1_STRING_length(*(ASN1_STRING **)(piVar34 + 2));
                if (iVar9 == 7) {
                  if ((local_c30 != (X509 *)(long)iVar13) ||
                     (iVar13 = bcmp(__s,error_buffer,(size_t)local_c30), iVar13 != 0))
                  goto LAB_003b8669;
                  bVar61 = false;
                  Curl_infof(local_c60," subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                             local_c18);
                  local_c38 = (BIO *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
                else {
                  if (((iVar9 != 2) ||
                      (pXVar35 = (X509 *)strlen((char *)__s), pXVar35 != (X509 *)(long)iVar13)) ||
                     (iVar13 = Curl_cert_hostcheck((char *)__s,(char *)local_c10), iVar13 == 0))
                  goto LAB_003b8669;
                  Curl_infof(local_c60," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                             local_c18,__s);
                  bVar61 = true;
                  pBVar25 = __s;
                }
              }
              else {
LAB_003b8669:
                bVar61 = false;
              }
              iVar58 = iVar58 + 1;
            }
            GENERAL_NAMES_free(a_00);
            pCVar53 = local_c18;
            pCVar52 = local_c60;
            pCVar32 = local_c20;
            if (bVar61 || ((ulong)local_c38 & 1) != 0) goto LAB_003b9441;
            if ((((byte)local_c58 | (byte)local_c28) & 1) == 0) goto LAB_003b8702;
            Curl_infof(local_c60," subjectAltName does not match %s\n",local_c18);
            Curl_failf(pCVar52,
                       "SSL: no alternative certificate subject name matches target host name \'%s\'"
                       ,pCVar53);
LAB_003b86f9:
            CVar11 = CURLE_PEER_FAILED_VERIFICATION;
          }
          BIO_free((BIO *)local_c48);
          X509_free(*(X509 **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10));
          lVar59 = *(long *)((long)&pXVar57[3].name + (long)pCVar4);
          goto LAB_003b96c1;
        }
      }
      else if ((conn->ssl_config).verifyhost == true) {
        pXVar35 = *(X509 **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10);
        local_c60 = conn->data;
        if (cVar10 == CURLPROXY_HTTPS) {
          iVar9 = conn->sock[1];
          goto LAB_003b8475;
        }
        ppcVar33 = &(conn->host).name;
        lVar59 = 0xd8;
        goto LAB_003b84ed;
      }
LAB_003b9441:
      CVar11 = CURLE_PEER_FAILED_VERIFICATION;
      pXVar26 = X509_get_issuer_name
                          (*(X509 **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10));
      iVar9 = x509_name_oneline((X509_NAME *)pXVar26,error_buffer_1,size_00);
      if (iVar9 == 0) {
        Curl_infof(pCVar32," issuer: %s\n",error_buffer_1);
        pCVar52 = local_c48;
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          pcVar48 = (pCVar32->set).proxy_ssl.issuercert;
        }
        else {
          pcVar48 = (pCVar32->set).ssl.issuercert;
        }
        if (pcVar48 != (char *)0x0) {
          lVar59 = BIO_ctrl((BIO *)local_c48,0x6c,3,pcVar48);
          if ((int)lVar59 < 1) {
            if ((char)local_c64 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar59 = 0xb70,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar59 = 0xac0;
              }
              Curl_failf(pCVar32,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((long)pCVar32->sockets + lVar59 + -0x80));
            }
            BIO_free((BIO *)pCVar52);
            goto LAB_003b99dc;
          }
          pXVar35 = PEM_read_bio_X509((BIO *)pCVar52,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar35 == (X509 *)0x0) {
            if ((char)local_c64 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar59 = 0xb70,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar59 = 0xac0;
              }
              Curl_failf(pCVar32,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((long)pCVar32->sockets + lVar59 + -0x80));
            }
            BIO_free((BIO *)pCVar52);
            pXVar35 = (X509 *)0x0;
          }
          else {
            iVar9 = X509_check_issued(pXVar35,*(X509 **)(*(long *)((long)&pXVar57[3].name +
                                                                  (long)pCVar4) + 0x10));
            if (iVar9 == 0) {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar59 = 0xb70,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar59 = 0xac0;
              }
              Curl_infof(pCVar32," SSL certificate issuer check ok (%s)\n",
                         *(undefined8 *)((long)pCVar32->sockets + lVar59 + -0x80));
              X509_free(pXVar35);
              goto LAB_003b9a6f;
            }
            if ((char)local_c64 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar59 = 0xb70,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar59 = 0xac0;
              }
              Curl_failf(pCVar32,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)pCVar32->sockets + lVar59 + -0x80));
            }
            BIO_free((BIO *)pCVar52);
          }
          X509_free(pXVar35);
LAB_003b99dc:
          X509_free(*(X509 **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10));
          *(undefined8 *)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10) = 0;
          return CURLE_SSL_ISSUER_ERROR;
        }
LAB_003b9a6f:
        lVar59 = SSL_get_verify_result
                           (*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8));
        *(long *)((long)pCVar32->sockets + (long)local_bf8 + -0x80) = lVar59;
        if (lVar59 == 0) {
          CVar11 = CURLE_OK;
          Curl_infof(pCVar32," SSL certificate verify ok.\n");
        }
        else {
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            if ((conn->proxy_ssl_config).verifypeer == false) {
LAB_003b9b7b:
              pcVar48 = X509_verify_cert_error_string(lVar59);
              CVar11 = CURLE_OK;
              Curl_infof(pCVar32," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                         pcVar48,lVar59);
              goto LAB_003b9482;
            }
          }
          else if ((conn->ssl_config).verifypeer != true) goto LAB_003b9b7b;
          if ((char)local_c64 != '\0') {
            pcVar48 = X509_verify_cert_error_string(lVar59);
            Curl_failf(pCVar32,"SSL certificate verify result: %s (%ld)",pcVar48,lVar59);
          }
        }
      }
      else if ((char)local_c64 != '\0') {
        Curl_failf(pCVar32,"SSL: couldn\'t get X509-issuer name!");
      }
LAB_003b9482:
      cVar10 = (conn->http_proxy).proxytype;
      if ((cVar10 == CURLPROXY_HTTPS) &&
         (iVar9 = conn->sock[1], conn->proxy_ssl[iVar9 != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_003b951f:
          pCVar52 = conn->data;
          local_c20 = pCVar32;
          lVar59 = SSL_ctrl(*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8),0x46,0,
                            error_buffer);
          if (error_buffer._0_8_ == 0) {
            pcVar48 = "No OCSP response received";
LAB_003b9688:
            resp = (OCSP_RESPONSE *)0x0;
LAB_003b968b:
            Curl_failf(pCVar52,pcVar48);
LAB_003b9695:
            CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)error_buffer,lVar59);
            if (resp == (OCSP_RESPONSE *)0x0) {
              pcVar48 = "Invalid OCSP response";
              goto LAB_003b9688;
            }
            uVar14 = OCSP_response_status(resp);
            if (uVar14 != 0) {
              pcVar48 = OCSP_response_status_str((long)(int)uVar14);
              Curl_failf(pCVar52,"Invalid OCSP response status: %s (%d)",pcVar48,(ulong)uVar14);
              goto LAB_003b9695;
            }
            bs = OCSP_response_get1_basic(resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              pcVar48 = "Invalid OCSP response";
              goto LAB_003b968b;
            }
            psVar24 = SSL_get_peer_cert_chain
                                (*(SSL **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 8));
            pXVar42 = SSL_CTX_get_cert_store
                                ((SSL_CTX *)**(undefined8 **)((long)&pXVar57[3].name + (long)pCVar4)
                                );
            iVar9 = OCSP_basic_verify(bs,psVar24,pXVar42,0);
            if (iVar9 < 1) {
              Curl_failf(pCVar52,"OCSP response verification failed");
              CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
            }
            else {
              for (iVar9 = 0; iVar12 = OCSP_resp_count(bs), iVar9 < iVar12; iVar9 = iVar9 + 1) {
                single = OCSP_resp_get0(bs,iVar9);
                if (single != (OCSP_SINGLERESP *)0x0) {
                  uVar14 = OCSP_single_get0_status
                                     (single,(int *)&psig,(ASN1_GENERALIZEDTIME **)&addr,
                                      (ASN1_GENERALIZEDTIME **)&x509,(ASN1_GENERALIZEDTIME **)&ptr);
                  iVar12 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)x509,
                                               (ASN1_GENERALIZEDTIME *)ptr,300,-1);
                  if (iVar12 == 0) {
                    Curl_failf(pCVar52,"OCSP response has expired");
                  }
                  else {
                    pcVar48 = OCSP_cert_status_str((long)(int)uVar14);
                    Curl_infof(pCVar52,"SSL certificate status: %s (%d)\n",pcVar48,(ulong)uVar14);
                    if (uVar14 != 2) {
                      if (uVar14 != 1) goto LAB_003b9971;
                      pcVar48 = OCSP_crl_reason_str((long)(int)psig);
                      Curl_failf(pCVar52,"SSL certificate revocation reason: %s (%d)",pcVar48,
                                 (ulong)psig & 0xffffffff);
                    }
                  }
                  CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
                  goto LAB_003b9cff;
                }
LAB_003b9971:
              }
              CVar11 = CURLE_OK;
            }
LAB_003b9cff:
            OCSP_BASICRESP_free(bs);
          }
          OCSP_RESPONSE_free(resp);
          if (CVar11 != CURLE_OK) {
            BIO_free((BIO *)local_c48);
            X509_free(*(X509 **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10));
            lVar59 = *(long *)((long)&pXVar57[3].name + (long)pCVar4);
LAB_003b96c1:
            *(undefined8 *)(lVar59 + 0x10) = 0;
            return CVar11;
          }
          cVar10 = (conn->http_proxy).proxytype;
          CVar11 = CURLE_OK;
          pCVar32 = local_c20;
          goto LAB_003b96dd;
        }
        CVar16 = CURLE_OK;
        if ((char)local_c64 != '\0') {
          CVar16 = CVar11;
        }
LAB_003b96fa:
        lVar59 = (ulong)(conn->proxy_ssl[iVar9 != -1].state != ssl_connection_complete) * 8 + 0xd68;
      }
      else {
        if ((conn->ssl_config).verifystatus == true) goto LAB_003b951f;
LAB_003b96dd:
        CVar16 = CURLE_OK;
        if ((char)local_c64 != '\0') {
          CVar16 = CVar11;
        }
        lVar59 = 0xd68;
        if (cVar10 == CURLPROXY_HTTPS) {
          iVar9 = conn->sock[1];
          goto LAB_003b96fa;
        }
      }
      pcVar48 = *(char **)((long)pCVar32->sockets + lVar59 + -0x80);
      local_bc0 = pcVar48;
      if ((CVar16 == CURLE_OK) && (pcVar48 != (char *)0x0)) {
        lVar59 = *(long *)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10);
        if (lVar59 == 0) {
LAB_003b97e2:
          CVar16 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          pXVar41 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar59);
          uVar14 = i2d_X509_PUBKEY(pXVar41,(uchar **)0x0);
          if ((int)uVar14 < 1) goto LAB_003b97e2;
          uVar21 = (ulong)uVar14;
          pubkey = (uchar *)(*Curl_cmalloc)(uVar21);
          error_buffer._0_8_ = pubkey;
          if (pubkey == (uchar *)0x0) goto LAB_003b97e2;
          pXVar41 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar59);
          uVar15 = i2d_X509_PUBKEY(pXVar41,(uchar **)error_buffer);
          if ((error_buffer._0_8_ == 0 || uVar14 != uVar15) ||
              error_buffer._0_8_ - (long)pubkey != uVar21) {
            CVar16 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            CVar16 = Curl_pin_peer_pubkey(pCVar32,pcVar48,pubkey,uVar21);
          }
          (*Curl_cfree)(pubkey);
          if (CVar16 == CURLE_OK) {
            CVar16 = CURLE_OK;
            goto LAB_003b97fc;
          }
        }
        Curl_failf(pCVar32,"SSL: public key does not match pinned public key!");
      }
LAB_003b97fc:
      BIO_free((BIO *)local_c48);
      X509_free(*(X509 **)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10));
      *(undefined8 *)(*(long *)((long)&pXVar57[3].name + (long)pCVar4) + 0x10) = 0;
      *(undefined4 *)((long)&pXVar57[3].valid + (long)pCVar4) = 5;
      if (CVar16 != CURLE_OK) {
        return CVar16;
      }
    }
  }
  else if (iVar9 != 5) {
    _Var8 = false;
    goto LAB_003b730c;
  }
  pcVar48 = (char *)((long)&pXVar57[3].signature + (long)(pCVar4->hexbuffer + 4));
  pcVar48[0] = '\x02';
  pcVar48[1] = '\0';
  pcVar48[2] = '\0';
  pcVar48[3] = '\0';
  conn->recv[local_bd0] = ossl_recv;
  conn->send[local_bd0] = ossl_send;
  _Var8 = true;
LAB_003b730c:
  *local_be0 = _Var8;
  *(undefined4 *)((long)&pXVar57[3].valid + (long)pCVar4) = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}